

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_todo.cpp
# Opt level: O1

void __thiscall Am_Window_ToDo::Remove(Am_Window_ToDo *this)

{
  Am_Window_ToDo *pAVar1;
  Am_Window_ToDo **ppAVar2;
  
  if (((this->prev != (Am_Window_ToDo *)0x0) || (this->next != (Am_Window_ToDo *)0x0)) ||
     (Window_ToDo_Head == this)) {
    pAVar1 = this->next;
    if (pAVar1 == (Am_Window_ToDo *)0x0) {
      ppAVar2 = &Window_ToDo_Tail;
    }
    else {
      ppAVar2 = &pAVar1->prev;
    }
    *ppAVar2 = this->prev;
    if (this->prev == (Am_Window_ToDo *)0x0) {
      ppAVar2 = &Window_ToDo_Head;
    }
    else {
      ppAVar2 = &this->prev->next;
    }
    *ppAVar2 = pAVar1;
    this->prev = (Am_Window_ToDo *)0x0;
    this->next = (Am_Window_ToDo *)0x0;
  }
  return;
}

Assistant:

void
Am_Window_ToDo::Remove()
{
  if (prev || next || (Window_ToDo_Head == this)) {
    if (next)
      next->prev = prev;
    else
      Window_ToDo_Tail = prev;
    if (prev)
      prev->next = next;
    else
      Window_ToDo_Head = next;
    prev = nullptr;
    next = nullptr;
  }
}